

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  uint uVar1;
  ImDrawChannel *pIVar2;
  unsigned_short *__src;
  ImDrawChannel *pIVar3;
  long lVar4;
  long lVar5;
  ImDrawCmd *pIVar6;
  unsigned_short *__dest;
  int iVar7;
  long lVar8;
  int iVar9;
  ImDrawCmd *pIVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined1 auVar14 [16];
  unsigned_short *local_40;
  
  if (1 < this->_Count) {
    SetCurrentChannel(this,draw_list,0);
    uVar1 = (draw_list->CmdBuffer).Size;
    if ((ulong)uVar1 != 0) {
      if ((int)uVar1 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/imgui/imgui.h"
                      ,0x50f,"T &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
      }
      if ((draw_list->CmdBuffer).Data[(ulong)uVar1 - 1].ElemCount == 0) {
        (draw_list->CmdBuffer).Size = uVar1 - 1;
      }
    }
    iVar13 = 0;
    if ((this->_Count < 1) || (lVar4 = (long)(draw_list->CmdBuffer).Size, lVar4 < 1)) {
      pIVar10 = (ImDrawCmd *)0x0;
    }
    else {
      pIVar10 = (draw_list->CmdBuffer).Data + lVar4 + -1;
    }
    if (pIVar10 != (ImDrawCmd *)0x0) {
      iVar13 = pIVar10->ElemCount + pIVar10->IdxOffset;
    }
    iVar9 = 0;
    iVar11 = 0;
    if (1 < this->_Count) {
      iVar11 = 0;
      lVar4 = 1;
      iVar9 = 0;
      do {
        if ((this->_Channels).Size <= lVar4) goto LAB_00166284;
        pIVar2 = (this->_Channels).Data;
        pIVar3 = pIVar2 + lVar4;
        iVar7 = pIVar2[lVar4]._CmdBuffer.Size;
        if ((0 < (long)iVar7) && ((pIVar3->_CmdBuffer).Data[(long)iVar7 + -1].ElemCount == 0)) {
          (pIVar3->_CmdBuffer).Size = iVar7 + -1;
        }
        lVar5 = (long)(pIVar3->_CmdBuffer).Size;
        if ((0 < lVar5) && (pIVar10 != (ImDrawCmd *)0x0)) {
          pIVar6 = (pIVar3->_CmdBuffer).Data;
          auVar14[0] = -(*(char *)&(pIVar6->ClipRect).x == *(char *)&(pIVar10->ClipRect).x);
          auVar14[1] = -(*(char *)((long)&(pIVar6->ClipRect).x + 1) ==
                        *(char *)((long)&(pIVar10->ClipRect).x + 1));
          auVar14[2] = -(*(char *)((long)&(pIVar6->ClipRect).x + 2) ==
                        *(char *)((long)&(pIVar10->ClipRect).x + 2));
          auVar14[3] = -(*(char *)((long)&(pIVar6->ClipRect).x + 3) ==
                        *(char *)((long)&(pIVar10->ClipRect).x + 3));
          auVar14[4] = -(*(char *)&(pIVar6->ClipRect).y == *(char *)&(pIVar10->ClipRect).y);
          auVar14[5] = -(*(char *)((long)&(pIVar6->ClipRect).y + 1) ==
                        *(char *)((long)&(pIVar10->ClipRect).y + 1));
          auVar14[6] = -(*(char *)((long)&(pIVar6->ClipRect).y + 2) ==
                        *(char *)((long)&(pIVar10->ClipRect).y + 2));
          auVar14[7] = -(*(char *)((long)&(pIVar6->ClipRect).y + 3) ==
                        *(char *)((long)&(pIVar10->ClipRect).y + 3));
          auVar14[8] = -(*(char *)&(pIVar6->ClipRect).z == *(char *)&(pIVar10->ClipRect).z);
          auVar14[9] = -(*(char *)((long)&(pIVar6->ClipRect).z + 1) ==
                        *(char *)((long)&(pIVar10->ClipRect).z + 1));
          auVar14[10] = -(*(char *)((long)&(pIVar6->ClipRect).z + 2) ==
                         *(char *)((long)&(pIVar10->ClipRect).z + 2));
          auVar14[0xb] = -(*(char *)((long)&(pIVar6->ClipRect).z + 3) ==
                          *(char *)((long)&(pIVar10->ClipRect).z + 3));
          auVar14[0xc] = -(*(char *)&(pIVar6->ClipRect).w == *(char *)&(pIVar10->ClipRect).w);
          auVar14[0xd] = -(*(char *)((long)&(pIVar6->ClipRect).w + 1) ==
                          *(char *)((long)&(pIVar10->ClipRect).w + 1));
          auVar14[0xe] = -(*(char *)((long)&(pIVar6->ClipRect).w + 2) ==
                          *(char *)((long)&(pIVar10->ClipRect).w + 2));
          auVar14[0xf] = -(*(char *)((long)&(pIVar6->ClipRect).w + 3) ==
                          *(char *)((long)&(pIVar10->ClipRect).w + 3));
          if ((((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar14[0xf] >> 7) << 0xf) == 0xffff) &&
              (((pIVar10->TextureId == pIVar6->TextureId &&
                (pIVar10->VtxOffset == pIVar6->VtxOffset)) &&
               (pIVar10->UserCallback == (ImDrawCallback)0x0)))) &&
             (pIVar6->UserCallback == (ImDrawCallback)0x0)) {
            pIVar10->ElemCount = pIVar10->ElemCount + pIVar6->ElemCount;
            iVar13 = iVar13 + pIVar6->ElemCount;
            memmove(pIVar6,pIVar6 + 1,lVar5 * 0x38 - 0x38);
            (pIVar3->_CmdBuffer).Size = (pIVar3->_CmdBuffer).Size + -1;
          }
        }
        iVar7 = (pIVar3->_CmdBuffer).Size;
        lVar5 = (long)iVar7;
        if (0 < lVar5) {
          pIVar10 = (pIVar3->_CmdBuffer).Data + lVar5 + -1;
        }
        iVar9 = iVar9 + (pIVar3->_IdxBuffer).Size;
        if (0 < iVar7) {
          pIVar6 = (pIVar3->_CmdBuffer).Data;
          lVar8 = 0;
          do {
            *(int *)((long)&pIVar6->IdxOffset + lVar8) = iVar13;
            iVar13 = iVar13 + *(int *)((long)&pIVar6->ElemCount + lVar8);
            lVar8 = lVar8 + 0x38;
          } while (lVar5 * 0x38 - lVar8 != 0);
        }
        iVar11 = iVar11 + iVar7;
        lVar4 = lVar4 + 1;
      } while (lVar4 < this->_Count);
    }
    iVar7 = (draw_list->CmdBuffer).Size + iVar11;
    iVar13 = (draw_list->CmdBuffer).Capacity;
    if (iVar13 < iVar7) {
      if (iVar13 == 0) {
        iVar12 = 8;
      }
      else {
        iVar12 = iVar13 / 2 + iVar13;
      }
      if (iVar12 <= iVar7) {
        iVar12 = iVar7;
      }
      if (iVar13 < iVar12) {
        pIVar6 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar12 * 0x38);
        pIVar10 = (draw_list->CmdBuffer).Data;
        if (pIVar10 != (ImDrawCmd *)0x0) {
          memcpy(pIVar6,pIVar10,(long)(draw_list->CmdBuffer).Size * 0x38);
          ImGui::MemFree((draw_list->CmdBuffer).Data);
        }
        (draw_list->CmdBuffer).Data = pIVar6;
        (draw_list->CmdBuffer).Capacity = iVar12;
      }
    }
    (draw_list->CmdBuffer).Size = iVar7;
    lVar4 = (long)(draw_list->IdxBuffer).Size + (long)iVar9;
    iVar13 = (draw_list->IdxBuffer).Capacity;
    iVar7 = (int)lVar4;
    if (iVar13 < iVar7) {
      if (iVar13 == 0) {
        iVar12 = 8;
      }
      else {
        iVar12 = iVar13 / 2 + iVar13;
      }
      if (iVar12 <= iVar7) {
        iVar12 = iVar7;
      }
      if (iVar13 < iVar12) {
        __dest = (unsigned_short *)ImGui::MemAlloc((long)iVar12 * 2);
        __src = (draw_list->IdxBuffer).Data;
        if (__src != (unsigned_short *)0x0) {
          memcpy(__dest,__src,(long)(draw_list->IdxBuffer).Size * 2);
          ImGui::MemFree((draw_list->IdxBuffer).Data);
        }
        (draw_list->IdxBuffer).Data = __dest;
        (draw_list->IdxBuffer).Capacity = iVar12;
      }
    }
    (draw_list->IdxBuffer).Size = iVar7;
    local_40 = (draw_list->IdxBuffer).Data + (lVar4 - iVar9);
    if (1 < this->_Count) {
      pIVar10 = (draw_list->CmdBuffer).Data + ((long)(draw_list->CmdBuffer).Size - (long)iVar11);
      lVar5 = 1;
      lVar4 = 0x38;
      do {
        if ((this->_Channels).Size <= lVar5) {
LAB_00166284:
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/imgui/imgui.h"
                        ,0x505,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
        }
        pIVar3 = (this->_Channels).Data;
        lVar8 = (long)*(int *)((long)pIVar3 + lVar4 + -0x18);
        if (lVar8 != 0) {
          memcpy(pIVar10,*(void **)((long)pIVar3 + lVar4 + -0x10),lVar8 * 0x38);
          pIVar10 = pIVar10 + lVar8;
        }
        lVar8 = (long)*(int *)((long)pIVar3 + lVar4 + -8);
        if (lVar8 != 0) {
          memcpy(local_40,*(void **)((long)&(pIVar3->_CmdBuffer).Size + lVar4),lVar8 * 2);
          local_40 = local_40 + lVar8;
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x20;
      } while (lVar5 < this->_Count);
    }
    draw_list->_IdxWritePtr = local_40;
    ImDrawList::UpdateClipRect(draw_list);
    ImDrawList::UpdateTextureID(draw_list);
    this->_Count = 1;
  }
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    if (draw_list->CmdBuffer.Size != 0 && draw_list->CmdBuffer.back().ElemCount == 0)
        draw_list->CmdBuffer.pop_back();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();
        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL && CanMergeDrawCommands(last_cmd, &ch._CmdBuffer[0]))
        {
            // Merge previous channel last draw command with current channel first draw command if matching.
            last_cmd->ElemCount += ch._CmdBuffer[0].ElemCount;
            idx_offset += ch._CmdBuffer[0].ElemCount;
            ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;
    draw_list->UpdateClipRect(); // We call this instead of AddDrawCmd(), so that empty channels won't produce an extra draw call.
    draw_list->UpdateTextureID();
    _Count = 1;
}